

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)

{
  int *piVar1;
  ImVector<unsigned_short> *pIVar2;
  ImGuiKeyData *pIVar3;
  float *pfVar4;
  float fVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  unsigned_short *puVar9;
  ImVec2 IVar10;
  int iVar11;
  uint uVar12;
  ImGuiInputEventMousePos IVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  ImGuiContext *pIVar17;
  int iVar18;
  uint uVar19;
  unsigned_short *__dest;
  ImGuiInputEvent *pIVar20;
  ImGuiInputEvent *pIVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  uint uVar25;
  char cVar26;
  undefined7 in_register_00000039;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  undefined8 *puVar30;
  uint uVar31;
  ulong uVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  ImBitArray<645,_0> key_changed_mask;
  uint local_88 [22];
  
  pIVar17 = GImGui;
  uVar32 = CONCAT71(in_register_00000039,trickle_fast_inputs);
  uVar31 = 0;
  bVar33 = false;
  if ((int)uVar32 != 0) {
    bVar33 = GImGui->WantTextInputNextFrame == 1;
  }
  local_88[0x10] = 0;
  local_88[0x11] = 0;
  local_88[0x12] = 0;
  local_88[0x13] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[0x14] = 0;
  uVar19 = (GImGui->InputEventsQueue).Size;
  if (0 < (int)uVar19) {
    lVar24 = 0;
    uVar29 = 0;
    bVar15 = false;
    bVar16 = false;
    bVar8 = false;
    bVar14 = false;
    uVar31 = 0;
    uVar27 = uVar32;
    do {
      pIVar20 = (pIVar17->InputEventsQueue).Data;
      cVar26 = (char)uVar27;
      switch(*(undefined4 *)((long)&pIVar20->Type + lVar24)) {
      case 1:
        uVar6 = *(undefined8 *)((long)&pIVar20->field_2 + lVar24);
        fVar34 = (float)uVar6;
        fVar35 = (float)((ulong)uVar6 >> 0x20);
        if ((-256000.0 <= fVar34) && (-256000.0 <= fVar35)) {
          fVar34 = (float)(int)((int)fVar34 - (uint)((float)(int)fVar34 != fVar34 && fVar34 < 0.0));
          fVar35 = (float)(int)((int)fVar35 - (uint)((float)(int)fVar35 != fVar35 && fVar35 < 0.0));
        }
        fVar5 = (pIVar17->IO).MousePos.x;
        if ((fVar5 == fVar34) && (!NAN(fVar5) && !NAN(fVar34))) {
          fVar5 = (pIVar17->IO).MousePos.y;
          if ((fVar5 == fVar35) && (!NAN(fVar5) && !NAN(fVar35))) break;
        }
        if ((cVar26 != '\0') && ((((uVar31 != 0 || (bVar16)) || (bVar8)) || (bVar14)))) {
LAB_00111d4a:
          if (uVar29 == 0) {
            uVar31 = 0;
            goto LAB_00111e74;
          }
          goto LAB_00111d53;
        }
        IVar10.y = fVar35;
        IVar10.x = fVar34;
        (pIVar17->IO).MousePos = IVar10;
        bVar15 = true;
        break;
      case 2:
        fVar34 = *(float *)((long)&pIVar20->field_2 + lVar24);
        if ((((fVar34 != 0.0) || (NAN(fVar34))) ||
            (fVar35 = *(float *)((long)&pIVar20->field_2 + lVar24 + 4), fVar35 != 0.0)) ||
           (NAN(fVar35))) {
          if ((cVar26 != '\0') && (bVar16 || uVar31 != 0)) goto LAB_00111d4a;
          (pIVar17->IO).MouseWheelH = fVar34 + (pIVar17->IO).MouseWheelH;
          (pIVar17->IO).MouseWheel =
               *(float *)((long)&pIVar20->field_2 + lVar24 + 4) + (pIVar17->IO).MouseWheel;
          bVar16 = true;
        }
        break;
      case 3:
        iVar23 = *(int *)((long)&pIVar20->field_2 + lVar24);
        bVar7 = *(bool *)((long)&pIVar20->field_2 + lVar24 + 4);
        if ((pIVar17->IO).MouseDown[iVar23] != bVar7) {
          uVar25 = 1 << ((byte)iVar23 & 0x1f);
          if ((cVar26 != '\0') && (((uVar25 & uVar31) != 0 || (bVar16)))) goto LAB_00111d4a;
          (pIVar17->IO).MouseDown[iVar23] = bVar7;
          uVar31 = uVar31 | uVar25;
        }
        break;
      case 4:
        uVar25 = *(uint *)((long)&pIVar20->field_2 + lVar24);
        pIVar3 = (pIVar17->IO).KeysData + (int)uVar25;
        bVar7 = *(bool *)((long)&pIVar20->field_2 + lVar24 + 4);
        if ((pIVar17->IO).KeysData[(int)uVar25].Down == bVar7) {
          pfVar4 = (float *)((long)&pIVar20->field_2 + lVar24 + 8);
          if ((pIVar3->AnalogValue == *pfVar4) && (!NAN(pIVar3->AnalogValue) && !NAN(*pfVar4)))
          break;
        }
        else if ((cVar26 != '\0') &&
                ((((local_88[(int)uVar25 >> 5] >> (uVar25 & 0x1f) & 1) != 0 || (bVar14)) ||
                 (uVar31 != 0)))) goto LAB_00111d4a;
        pIVar3->Down = bVar7;
        pIVar3->AnalogValue = *(float *)((long)&pIVar20->field_2 + lVar24 + 8);
        local_88[(int)uVar25 >> 5] = local_88[(int)uVar25 >> 5] | 1 << ((byte)uVar25 & 0x1f);
        switch(uVar25) {
        case 0x281:
          (pIVar17->IO).KeyCtrl = bVar7;
          break;
        case 0x282:
          (pIVar17->IO).KeyShift = bVar7;
          break;
        case 0x283:
          (pIVar17->IO).KeyAlt = bVar7;
          break;
        case 0x284:
          (pIVar17->IO).KeySuper = bVar7;
          break;
        default:
          goto switchD_00111b4d_default;
        }
        bVar8 = (GImGui->IO).KeyCtrl;
        uVar12 = bVar8 + 2;
        if ((GImGui->IO).KeyShift == false) {
          uVar12 = (uint)bVar8;
        }
        uVar28 = uVar12 + 4;
        if ((GImGui->IO).KeyAlt == false) {
          uVar28 = uVar12;
        }
        uVar12 = uVar28 + 8;
        if ((GImGui->IO).KeySuper == false) {
          uVar12 = uVar28;
        }
        (pIVar17->IO).KeyMods = uVar12;
switchD_00111b4d_default:
        (pIVar17->IO).KeysDown[(int)uVar25] = bVar7;
        lVar22 = (long)(pIVar17->IO).KeyMap[(int)uVar25];
        bVar8 = true;
        if (lVar22 != -1) {
          (pIVar17->IO).KeysDown[lVar22] = pIVar3->Down;
        }
        break;
      case 5:
        if (cVar26 != '\0') {
          if (bVar8) {
            if ((!bVar33 && !bVar15) && uVar31 == 0) {
LAB_00111b6e:
              if (!bVar16) goto LAB_00111b79;
            }
          }
          else if (uVar31 == 0 && !bVar15) goto LAB_00111b6e;
          goto LAB_00111d4a;
        }
LAB_00111b79:
        uVar19 = *(uint *)((long)&pIVar20->field_2 + lVar24);
        if (0xffff < uVar19) {
          uVar19 = 0xfffd;
        }
        iVar23 = (pIVar17->IO).InputQueueCharacters.Size;
        if (iVar23 == (pIVar17->IO).InputQueueCharacters.Capacity) {
          if (iVar23 == 0) {
            iVar18 = 8;
          }
          else {
            iVar18 = iVar23 / 2 + iVar23;
          }
          iVar11 = iVar23 + 1;
          if (iVar23 + 1 < iVar18) {
            iVar11 = iVar18;
          }
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          __dest = (unsigned_short *)(*GImAllocatorAllocFunc)((long)iVar11 * 2,GImAllocatorUserData)
          ;
          puVar9 = (pIVar17->IO).InputQueueCharacters.Data;
          if (puVar9 != (unsigned_short *)0x0) {
            memcpy(__dest,puVar9,(long)(pIVar17->IO).InputQueueCharacters.Size * 2);
            puVar9 = (pIVar17->IO).InputQueueCharacters.Data;
            if ((puVar9 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(puVar9,GImAllocatorUserData);
          }
          (pIVar17->IO).InputQueueCharacters.Data = __dest;
          (pIVar17->IO).InputQueueCharacters.Capacity = iVar11;
          iVar23 = (pIVar17->IO).InputQueueCharacters.Size;
          uVar27 = uVar32 & 0xffffffff;
        }
        else {
          __dest = (pIVar17->IO).InputQueueCharacters.Data;
        }
        __dest[iVar23] = (unsigned_short)uVar19;
        pIVar2 = &(pIVar17->IO).InputQueueCharacters;
        pIVar2->Size = pIVar2->Size + 1;
        if (bVar33) {
          bVar14 = true;
        }
        uVar19 = (pIVar17->InputEventsQueue).Size;
        break;
      case 6:
        (pIVar17->IO).AppFocusLost = (bool)(*(byte *)((long)&pIVar20->field_2 + lVar24) ^ 1);
      }
      uVar29 = uVar29 + 1;
      lVar24 = lVar24 + 0x18;
    } while ((long)uVar29 < (long)(int)uVar19);
LAB_00111d53:
    uVar32 = uVar29 & 0xffffffff;
    iVar23 = (pIVar17->InputEventsTrail).Size;
    lVar24 = 0;
    do {
      puVar30 = (undefined8 *)((long)&((pIVar17->InputEventsQueue).Data)->Type + lVar24);
      if (iVar23 == (pIVar17->InputEventsTrail).Capacity) {
        if (iVar23 == 0) {
          iVar18 = 8;
        }
        else {
          iVar18 = iVar23 / 2 + iVar23;
        }
        iVar11 = iVar23 + 1;
        if (iVar23 + 1 < iVar18) {
          iVar11 = iVar18;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar20 = (ImGuiInputEvent *)
                  (*GImAllocatorAllocFunc)((long)iVar11 * 0x18,GImAllocatorUserData);
        pIVar21 = (pIVar17->InputEventsTrail).Data;
        if (pIVar21 != (ImGuiInputEvent *)0x0) {
          memcpy(pIVar20,pIVar21,(long)(pIVar17->InputEventsTrail).Size * 0x18);
          pIVar21 = (pIVar17->InputEventsTrail).Data;
          if ((pIVar21 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar21,GImAllocatorUserData);
        }
        (pIVar17->InputEventsTrail).Data = pIVar20;
        (pIVar17->InputEventsTrail).Capacity = iVar11;
        iVar23 = (pIVar17->InputEventsTrail).Size;
      }
      else {
        pIVar20 = (pIVar17->InputEventsTrail).Data;
      }
      *(undefined8 *)((long)&pIVar20[iVar23].field_2 + 8) = puVar30[2];
      uVar6 = *puVar30;
      IVar13 = *(ImGuiInputEventMousePos *)(puVar30 + 1);
      pIVar20 = pIVar20 + iVar23;
      pIVar20->Type = (int)uVar6;
      pIVar20->Source = (int)((ulong)uVar6 >> 0x20);
      (pIVar20->field_2).MousePos = IVar13;
      iVar23 = (pIVar17->InputEventsTrail).Size + 1;
      (pIVar17->InputEventsTrail).Size = iVar23;
      lVar24 = lVar24 + 0x18;
      uVar32 = uVar32 - 1;
    } while (uVar32 != 0);
    uVar19 = (pIVar17->InputEventsQueue).Size;
    uVar31 = (uint)uVar29;
  }
LAB_00111e74:
  if (uVar31 == uVar19) {
    iVar23 = 0;
    if ((pIVar17->InputEventsQueue).Capacity < 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      iVar23 = 0;
      pIVar21 = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      pIVar20 = (pIVar17->InputEventsQueue).Data;
      if (pIVar20 != (ImGuiInputEvent *)0x0) {
        memcpy(pIVar21,pIVar20,(long)(pIVar17->InputEventsQueue).Size * 0x18);
        pIVar20 = (pIVar17->InputEventsQueue).Data;
        if ((pIVar20 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar20,GImAllocatorUserData);
      }
      (pIVar17->InputEventsQueue).Data = pIVar21;
      (pIVar17->InputEventsQueue).Capacity = 0;
    }
  }
  else {
    pIVar20 = (pIVar17->InputEventsQueue).Data;
    memmove(pIVar20,pIVar20 + uVar31,((long)(int)uVar19 - (ulong)uVar31) * 0x18);
    iVar23 = (pIVar17->InputEventsQueue).Size - uVar31;
  }
  (pIVar17->InputEventsQueue).Size = iVar23;
  if ((pIVar17->IO).AppFocusLost == true) {
    memset((pIVar17->IO).KeysDown,0,0x285);
    lVar24 = 0xe08;
    do {
      *(undefined1 *)((long)pIVar17 + lVar24 + -4) = 0;
      *(undefined8 *)(&pIVar17->Initialized + lVar24) = 0xbf800000bf800000;
      lVar24 = lVar24 + 0x10;
    } while (lVar24 != 0x3658);
    (pIVar17->IO).KeyMods = 0;
    (pIVar17->IO).KeyCtrl = false;
    (pIVar17->IO).KeyShift = false;
    (pIVar17->IO).KeyAlt = false;
    (pIVar17->IO).KeySuper = false;
    lVar24 = -0x14;
    do {
      pfVar4 = (pIVar17->IO).NavInputsDownDurationPrev + lVar24 + 0x14;
      pfVar4[0] = -1.0;
      pfVar4[1] = -1.0;
      pfVar4[2] = -1.0;
      pfVar4[3] = -1.0;
      pfVar4 = (pIVar17->IO).NavInputsDownDurationPrev + lVar24;
      pfVar4[0] = -1.0;
      pfVar4[1] = -1.0;
      pfVar4[2] = -1.0;
      pfVar4[3] = -1.0;
      lVar24 = lVar24 + 4;
    } while (lVar24 != 0);
    (pIVar17->IO).AppFocusLost = false;
  }
  return;
}

Assistant:

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;

    // Only trickle chars<>key when working with InputText()
    // FIXME: InputText() could parse event trail?
    // FIXME: Could specialize chars<>keys trickling rules for control keys (those not typically associated to characters)
    const bool trickle_interleaved_keys_and_text = (trickle_fast_inputs && g.WantTextInputNextFrame == 1);

    bool mouse_moved = false, mouse_wheeled = false, key_changed = false, text_inputted = false;
    int  mouse_button_changed = 0x00;
    ImBitArray<ImGuiKey_KeysData_SIZE> key_changed_mask;

    int event_n = 0;
    for (; event_n < g.InputEventsQueue.Size; event_n++)
    {
        const ImGuiInputEvent* e = &g.InputEventsQueue[event_n];
        if (e->Type == ImGuiInputEventType_MousePos)
        {
            ImVec2 event_pos(e->MousePos.PosX, e->MousePos.PosY);
            if (IsMousePosValid(&event_pos))
                event_pos = ImVec2(ImFloorSigned(event_pos.x), ImFloorSigned(event_pos.y)); // Apply same flooring as UpdateMouseInputs()
            if (io.MousePos.x != event_pos.x || io.MousePos.y != event_pos.y)
            {
                // Trickling Rule: Stop processing queued events if we already handled a mouse button change
                if (trickle_fast_inputs && (mouse_button_changed != 0 || mouse_wheeled || key_changed || text_inputted))
                    break;
                io.MousePos = event_pos;
                mouse_moved = true;
            }
        }
        else if (e->Type == ImGuiInputEventType_MouseButton)
        {
            const ImGuiMouseButton button = e->MouseButton.Button;
            IM_ASSERT(button >= 0 && button < ImGuiMouseButton_COUNT);
            if (io.MouseDown[button] != e->MouseButton.Down)
            {
                // Trickling Rule: Stop processing queued events if we got multiple action on the same button
                if (trickle_fast_inputs && ((mouse_button_changed & (1 << button)) || mouse_wheeled))
                    break;
                io.MouseDown[button] = e->MouseButton.Down;
                mouse_button_changed |= (1 << button);
            }
        }
        else if (e->Type == ImGuiInputEventType_MouseWheel)
        {
            if (e->MouseWheel.WheelX != 0.0f || e->MouseWheel.WheelY != 0.0f)
            {
                // Trickling Rule: Stop processing queued events if we got multiple action on the event
                if (trickle_fast_inputs && (mouse_wheeled || mouse_button_changed != 0))
                    break;
                io.MouseWheelH += e->MouseWheel.WheelX;
                io.MouseWheel += e->MouseWheel.WheelY;
                mouse_wheeled = true;
            }
        }
        else if (e->Type == ImGuiInputEventType_Key)
        {
            ImGuiKey key = e->Key.Key;
            IM_ASSERT(key != ImGuiKey_None);
            const int keydata_index = (key - ImGuiKey_KeysData_OFFSET);
            ImGuiKeyData* keydata = &io.KeysData[keydata_index];
            if (keydata->Down != e->Key.Down || keydata->AnalogValue != e->Key.AnalogValue)
            {
                // Trickling Rule: Stop processing queued events if we got multiple action on the same button
                if (trickle_fast_inputs && keydata->Down != e->Key.Down && (key_changed_mask.TestBit(keydata_index) || text_inputted || mouse_button_changed != 0))
                    break;
                keydata->Down = e->Key.Down;
                keydata->AnalogValue = e->Key.AnalogValue;
                key_changed = true;
                key_changed_mask.SetBit(keydata_index);

                if (key == ImGuiKey_ModCtrl || key == ImGuiKey_ModShift || key == ImGuiKey_ModAlt || key == ImGuiKey_ModSuper)
                {
                    if (key == ImGuiKey_ModCtrl) { io.KeyCtrl = keydata->Down; }
                    if (key == ImGuiKey_ModShift) { io.KeyShift = keydata->Down; }
                    if (key == ImGuiKey_ModAlt) { io.KeyAlt = keydata->Down; }
                    if (key == ImGuiKey_ModSuper) { io.KeySuper = keydata->Down; }
                    io.KeyMods = GetMergedKeyModFlags();
                }

                // Allow legacy code using io.KeysDown[GetKeyIndex()] with new backends
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
                io.KeysDown[key] = keydata->Down;
                if (io.KeyMap[key] != -1)
                    io.KeysDown[io.KeyMap[key]] = keydata->Down;
#endif
            }
        }
        else if (e->Type == ImGuiInputEventType_Text)
        {
            // Trickling Rule: Stop processing queued events if keys/mouse have been interacted with
            if (trickle_fast_inputs && ((key_changed && trickle_interleaved_keys_and_text) || mouse_button_changed != 0 || mouse_moved || mouse_wheeled))
                break;
            unsigned int c = e->Text.Char;
            io.InputQueueCharacters.push_back(c <= IM_UNICODE_CODEPOINT_MAX ? (ImWchar)c : IM_UNICODE_CODEPOINT_INVALID);
            if (trickle_interleaved_keys_and_text)
                text_inputted = true;
        }
        else if (e->Type == ImGuiInputEventType_Focus)
        {
            // We intentionally overwrite this and process lower, in order to give a chance
            // to multi-viewports backends to queue AddFocusEvent(false) + AddFocusEvent(true) in same frame.
            io.AppFocusLost = !e->AppFocused.Focused;
        }
        else
        {
            IM_ASSERT(0 && "Unknown event!");
        }
    }

    // Record trail (for domain-specific applications wanting to access a precise trail)
    //if (event_n != 0) IMGUI_DEBUG_LOG("Processed: %d / Remaining: %d\n", event_n, g.InputEventsQueue.Size - event_n);
    for (int n = 0; n < event_n; n++)
        g.InputEventsTrail.push_back(g.InputEventsQueue[n]);

    // [DEBUG]
    /*if (event_n != 0)
        for (int n = 0; n < g.InputEventsQueue.Size; n++)
            DebugLogInputEvent(n < event_n ? "Processed" : "Remaining", &g.InputEventsQueue[n]);*/

    // Remaining events will be processed on the next frame
    if (event_n == g.InputEventsQueue.Size)
        g.InputEventsQueue.resize(0);
    else
        g.InputEventsQueue.erase(g.InputEventsQueue.Data, g.InputEventsQueue.Data + event_n);

    // Clear buttons state when focus is lost
    // (this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle)
    if (g.IO.AppFocusLost)
    {
        g.IO.ClearInputKeys();
        g.IO.AppFocusLost = false;
    }
}